

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O3

void __thiscall
DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount>::RemoveElement<Memory::HeapAllocator>
          (DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *this,
          HeapAllocator *allocator,GuestArenaAllocator *element)

{
  void *pvVar1;
  code *pcVar2;
  bool bVar3;
  DListNode<Memory::Recycler::GuestArenaAllocator> *pDVar4;
  undefined4 *puVar5;
  void **buffer;
  
  buffer = &element[-1].super_ArenaAllocator.
            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.freeList;
  pDVar4 = (DListNode<Memory::Recycler::GuestArenaAllocator> *)this;
  do {
    pDVar4 = (pDVar4->super_DListNodeBase<Memory::Recycler::GuestArenaAllocator>).next.node;
    if (pDVar4 == (DListNode<Memory::Recycler::GuestArenaAllocator> *)this) break;
  } while (pDVar4 != (DListNode<Memory::Recycler::GuestArenaAllocator> *)buffer);
  if (pDVar4 == (DListNode<Memory::Recycler::GuestArenaAllocator> *)this) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                       ,0x175,"(HasNode(node))","HasNode(node)");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  pvVar1 = *buffer;
  **(long **)&element[-1].pendingDelete = (long)pvVar1;
  *(undefined8 *)((long)pvVar1 + 8) = *(undefined8 *)&element[-1].pendingDelete;
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::~ArenaAllocatorBase
            ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)element);
  Memory::HeapAllocator::Free(allocator,buffer,0x98);
  (this->super_RealCount).count = (this->super_RealCount).count - 1;
  return;
}

Assistant:

void RemoveElement(TAllocator * allocator, TData * element)
    {
        Node * node = CONTAINING_RECORD(element, Node, data);
#if DBG_DUMP
        Assert(HasNode(node));
#endif
        DListBase::RemoveNode(node);
        AllocatorDelete(TAllocator, allocator, node);

        this->DecrementCount();

    }